

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::get_variable_scratch
               (char_t (*buffer) [32],xpath_variable_set *set,char_t *begin,char_t *end,
               xpath_variable **out_result)

{
  ulong __n;
  xpath_variable_set *this;
  xpath_variable *pxVar1;
  long in_RCX;
  void *in_RDX;
  xpath_variable_set *in_RDI;
  undefined8 *in_R8;
  char_t *scratch;
  size_t length;
  char_t *in_stack_ffffffffffffffb8;
  bool local_1;
  
  __n = in_RCX - (long)in_RDX;
  this = in_RDI;
  if ((__n < 0x20) ||
     (this = (xpath_variable_set *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (__n + 1), this != (xpath_variable_set *)0x0)) {
    memcpy(this,in_RDX,__n);
    *(undefined1 *)((long)this + __n) = 0;
    pxVar1 = xpath_variable_set::get(this,in_stack_ffffffffffffffb8);
    *in_R8 = pxVar1;
    if (this != in_RDI) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (this);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PUGI__FN bool get_variable_scratch(char_t (&buffer)[32], xpath_variable_set* set, const char_t* begin, const char_t* end, xpath_variable** out_result)
	{
		size_t length = static_cast<size_t>(end - begin);
		char_t* scratch = buffer;

		if (length >= sizeof(buffer) / sizeof(buffer[0]))
		{
			// need to make dummy on-heap copy
			scratch = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
			if (!scratch) return false;
		}

		// copy string to zero-terminated buffer and perform lookup
		memcpy(scratch, begin, length * sizeof(char_t));
		scratch[length] = 0;

		*out_result = set->get(scratch);

		// free dummy buffer
		if (scratch != buffer) xml_memory::deallocate(scratch);

		return true;
	}